

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O0

Abc_Obj_t * Io_NtkBfsPads(Abc_Ntk_t *pNtk,Abc_Obj_t *pTerm,uint numTerms,int *pOrdered)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *local_80;
  int local_50;
  int i;
  int foundNeighbor;
  Abc_Obj_t *pNeighbor;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pNet;
  Vec_Ptr_t *vNeighbors;
  int *pOrdered_local;
  uint numTerms_local;
  Abc_Obj_t *pTerm_local;
  Abc_Ntk_t *pNtk_local;
  
  p = Vec_PtrAlloc(numTerms);
  bVar1 = false;
  iVar2 = Abc_ObjIsPi(pTerm);
  if ((iVar2 == 0) && (iVar2 = Abc_ObjIsPo(pTerm), iVar2 == 0)) {
    __assert_fail("Abc_ObjIsPi(pTerm) || Abc_ObjIsPo(pTerm)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteBook.c"
                  ,0x312,"Abc_Obj_t *Io_NtkBfsPads(Abc_Ntk_t *, Abc_Obj_t *, unsigned int, int *)");
  }
  Abc_NtkIncrementTravId(pNtk);
  Abc_NodeSetTravIdCurrent(pTerm);
  iVar2 = Abc_ObjIsPi(pTerm);
  if (iVar2 == 0) {
    pAVar4 = Abc_ObjFanin0(pTerm);
    for (local_50 = 0; iVar2 = Abc_ObjFaninNum(pAVar4), local_50 < iVar2; local_50 = local_50 + 1) {
      pAVar5 = Abc_ObjFanin(pAVar4,local_50);
      Vec_PtrPush(p,pAVar5);
    }
  }
  else {
    pAVar4 = Abc_ObjFanout0(pTerm);
    for (local_50 = 0; iVar2 = Abc_ObjFanoutNum(pAVar4), local_50 < iVar2; local_50 = local_50 + 1)
    {
      pAVar5 = Abc_ObjFanout(pAVar4,local_50);
      Vec_PtrPush(p,pAVar5);
    }
  }
  do {
    do {
      iVar2 = Vec_PtrSize(p);
      if (iVar2 < 1) {
LAB_0036687d:
        local_80 = pTerm;
        if (bVar1) {
          local_80 = _i;
        }
        return local_80;
      }
      _i = (Abc_Obj_t *)Vec_PtrEntry(p,0);
      iVar2 = Abc_ObjIsNode(_i);
      if ((iVar2 == 0) && (iVar2 = Abc_ObjIsTerm(_i), iVar2 == 0)) {
        __assert_fail("Abc_ObjIsNode(pNeighbor) || Abc_ObjIsTerm(pNeighbor)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteBook.c"
                      ,0x325,
                      "Abc_Obj_t *Io_NtkBfsPads(Abc_Ntk_t *, Abc_Obj_t *, unsigned int, int *)");
      }
      Vec_PtrRemove(p,_i);
      iVar2 = Abc_NodeIsTravIdCurrent(_i);
    } while (iVar2 != 0);
    Abc_NodeSetTravIdCurrent(_i);
    iVar2 = Abc_ObjIsPi(_i);
    if (((iVar2 != 0) || (iVar2 = Abc_ObjIsPo(_i), iVar2 != 0)) &&
       (uVar3 = Abc_ObjId(_i), pOrdered[uVar3] == 0)) {
      bVar1 = true;
      goto LAB_0036687d;
    }
    iVar2 = Abc_ObjFanoutNum(_i);
    if (iVar2 != 0) {
      pNode = Abc_ObjFanout0(_i);
      iVar2 = Abc_NtkIsComb(pNtk);
      if ((iVar2 == 0) && (iVar2 = Abc_ObjIsLatch(pNode), iVar2 != 0)) {
        pAVar4 = Abc_ObjFanout0(pNode);
        pNode = Abc_ObjFanout0(pAVar4);
      }
      for (local_50 = 0; iVar2 = Abc_ObjFanoutNum(pNode), local_50 < iVar2; local_50 = local_50 + 1)
      {
        pAVar4 = Abc_ObjFanout(pNode,local_50);
        iVar2 = Abc_NodeIsTravIdCurrent(pAVar4);
        if (iVar2 == 0) {
          Vec_PtrPush(p,pAVar4);
        }
      }
    }
    iVar2 = Abc_ObjFaninNum(_i);
    if (iVar2 != 0) {
      iVar2 = Abc_NtkIsComb(pNtk);
      if (iVar2 == 0) {
        pAVar4 = Abc_ObjFanin0(_i);
        iVar2 = Abc_ObjIsLatch(pAVar4);
        if (iVar2 != 0) {
          pAVar4 = Abc_ObjFanin0(_i);
          _i = Abc_ObjFanin0(pAVar4);
        }
      }
      for (local_50 = 0; iVar2 = Abc_ObjFaninNum(_i), local_50 < iVar2; local_50 = local_50 + 1) {
        pAVar4 = Abc_ObjFanin(_i,local_50);
        pAVar4 = Abc_ObjFanin0(pAVar4);
        iVar2 = Abc_NodeIsTravIdCurrent(pAVar4);
        if (iVar2 == 0) {
          Vec_PtrPush(p,pAVar4);
        }
      }
    }
  } while( true );
}

Assistant:

Abc_Obj_t * Io_NtkBfsPads( Abc_Ntk_t * pNtk, Abc_Obj_t * pTerm, unsigned numTerms, int * pOrdered )
{
    Vec_Ptr_t * vNeighbors = Vec_PtrAlloc ( numTerms ); 
    Abc_Obj_t * pNet, * pNode, * pNeighbor;
    int foundNeighbor=0;
    int i;

    assert(Abc_ObjIsPi(pTerm) || Abc_ObjIsPo(pTerm) );
    Abc_NtkIncrementTravId ( pNtk );
    Abc_NodeSetTravIdCurrent( pTerm );
    if(Abc_ObjIsPi(pTerm))
    {
	pNet = Abc_ObjFanout0(pTerm);
	Abc_ObjForEachFanout( pNet, pNode, i ) 
	    Vec_PtrPush( vNeighbors, pNode );
    }
    else 
    {
	pNet = Abc_ObjFanin0(pTerm);
	Abc_ObjForEachFanin( pNet, pNode, i ) 
	    Vec_PtrPush( vNeighbors, pNode );   
    }

    while ( Vec_PtrSize(vNeighbors) >0 )
    {
	pNeighbor = (Abc_Obj_t *)Vec_PtrEntry( vNeighbors, 0 );
	assert( Abc_ObjIsNode(pNeighbor) || Abc_ObjIsTerm(pNeighbor) );
	Vec_PtrRemove( vNeighbors, pNeighbor );

	if( Abc_NodeIsTravIdCurrent( pNeighbor ) )
	    continue;
	Abc_NodeSetTravIdCurrent( pNeighbor );

	if( ((Abc_ObjIsPi(pNeighbor) || Abc_ObjIsPo(pNeighbor))) && !pOrdered[Abc_ObjId(pNeighbor)] )
	{
	    foundNeighbor=1;
	    break;
	}
	if( Abc_ObjFanoutNum( pNeighbor ) )
	{   
	    pNet=Abc_ObjFanout0( pNeighbor );
	    if( !Abc_NtkIsComb(pNtk) && Abc_ObjIsLatch(pNet) )
		pNet=Abc_ObjFanout0( Abc_ObjFanout0(pNet) );
	    Abc_ObjForEachFanout( pNet, pNode, i )
		if( !Abc_NodeIsTravIdCurrent(pNode) ) 
		    Vec_PtrPush( vNeighbors, pNode ); 
	}
	if( Abc_ObjFaninNum( pNeighbor ) )
	{
	    if( !Abc_NtkIsComb(pNtk) && Abc_ObjIsLatch(Abc_ObjFanin0(pNeighbor)) )
		pNeighbor=Abc_ObjFanin0( Abc_ObjFanin0(pNeighbor) );
	    Abc_ObjForEachFanin( pNeighbor, pNet, i )
		if( !Abc_NodeIsTravIdCurrent(pNode=Abc_ObjFanin0(pNet)) ) 
		    Vec_PtrPush( vNeighbors, pNode );
	}
    }
    return ( foundNeighbor ) ? pNeighbor : pTerm;
}